

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<float>::FindGreater
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<float> *this,float k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Addr Cp;
  IndexNode<float> C;
  Addr local_a8;
  long local_a0;
  long local_98;
  IndexNode<float> local_90;
  
  IndexNode<float>::IndexNode(&local_90,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff != -1) {
    if (EQ) {
      iVar2 = FindFirstKey(this,k,&local_a8);
    }
    else {
      iVar2 = FindNextKey(this,k,&local_a8);
    }
    if (iVar2 != -1) {
      FindNode(this,local_a8,&local_90);
      local_a0 = (long)iVar2;
      do {
        lVar3 = local_a0 << 0x20;
        local_98 = local_a0 * 8;
        lVar5 = lVar3;
        lVar7 = local_98;
        lVar8 = local_a0;
        do {
          do {
            while( true ) {
              lVar4 = (long)this->N;
              if ((lVar4 + -1 <= lVar8) ||
                 (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8] != '1')) break;
              std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
              _M_insert_unique<Addr_const&>
                        ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                          *)__return_storage_ptr__,
                         (Addr *)((long)&(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->BlockNum +
                                 lVar7));
              lVar5 = lVar5 + 0x100000000;
              lVar7 = lVar7 + 8;
              lVar8 = lVar8 + 1;
            }
            if ((int)lVar8 == (int)(lVar4 + -1)) {
              if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4 + -1].FileOff == -1) goto LAB_0012a040;
              goto LAB_0012a01e;
            }
            lVar6 = lVar5 >> 0x20;
            lVar5 = lVar3;
            lVar7 = local_98;
            lVar8 = local_a0;
          } while (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6] != '0');
          if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4 + -1].FileOff == -1) goto LAB_0012a040;
        } while (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6] != '0');
LAB_0012a01e:
        FindNode(this,local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar4 + -1],&local_90);
        local_a0 = 0;
      } while( true );
    }
    std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
              (&__return_storage_ptr__->_M_t);
  }
LAB_0012a040:
  IndexNode<float>::~IndexNode(&local_90);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindGreater(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos;
	Addr Cp;
	if (this->RootAddr.FileOff == -1)
		return ret;
	if (EQ == false) {
		pos = this->FindNextKey(k, Cp);
	}
	else {
		pos = this->FindFirstKey(k, Cp);
	}
    if(pos == -1){
        ret.clear();
        return ret;
    }
	this->FindNode(Cp, C);
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1'; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}